

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtCopy(word *pOut,word *pIn,int nWords,int fCompl)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  if (0 < nWords) {
    uVar1 = (ulong)(uint)nWords;
  }
  if (fCompl == 0) {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      pOut[uVar2] = pIn[uVar2];
    }
  }
  else {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      pOut[uVar2] = ~pIn[uVar2];
    }
  }
  return;
}

Assistant:

static inline void Abc_TtCopy( word * pOut, word * pIn, int nWords, int fCompl )
{
    int w;
    if ( fCompl )
        for ( w = 0; w < nWords; w++ )
            pOut[w] = ~pIn[w];
    else
        for ( w = 0; w < nWords; w++ )
            pOut[w] = pIn[w];
}